

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleServer.cpp
# Opt level: O2

void __thiscall CustomServer::CustomServer(CustomServer *this,uint16_t port)

{
  blcl::net::server_interface<MsgType>::server_interface
            (&this->super_server_interface<MsgType>,port);
  (this->super_server_interface<MsgType>)._vptr_server_interface =
       (_func_int **)&PTR__CustomServer_00122460;
  (this->fail2ban_counter_)._M_h._M_buckets = &(this->fail2ban_counter_)._M_h._M_single_bucket;
  (this->fail2ban_counter_)._M_h._M_bucket_count = 1;
  (this->fail2ban_counter_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->fail2ban_counter_)._M_h._M_element_count = 0;
  (this->fail2ban_counter_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->fail2ban_counter_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->fail2ban_counter_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->max_fail_attempt = 10;
  return;
}

Assistant:

CustomServer(uint16_t port) : blcl::net::server_interface<MsgType>(port) {

    }